

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O0

Iterator * __thiscall bitset_detail::IntBitSet<unsigned_int>::Iterator::operator++(Iterator *this)

{
  uint uVar1;
  Iterator *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  undefined7 in_stack_fffffffffffffff0;
  bool *val;
  
  val = *(bool **)(in_FS_OFFSET + 0x28);
  inline_assertion_check<false,bool>
            (val,(char *)CONCAT17(in_RDI->m_val != 0,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20),(char *)in_RDI,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  in_RDI->m_val = in_RDI->m_val - 1 & in_RDI->m_val;
  if (in_RDI->m_val != 0) {
    uVar1 = std::countr_zero<unsigned_int>(in_stack_ffffffffffffffdc);
    in_RDI->m_pos = uVar1;
  }
  if (*(bool **)(in_FS_OFFSET + 0x28) == val) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

constexpr Iterator& operator++() noexcept
        {
            Assume(m_val != 0);
            m_val &= m_val - I{1U};
            if (m_val != 0) m_pos = std::countr_zero(m_val);
            return *this;
        }